

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O0

void __thiscall SQSharedState::~SQSharedState(SQSharedState *this)

{
  SQCollectable_conflict *pSVar1;
  bool bVar2;
  SQObjectPtr *this_00;
  SQUnsignedInteger SVar3;
  SQCollectable_conflict *nx;
  SQCollectable_conflict *t;
  SQSharedState *this_local;
  
  if (this->_releasehook != (SQRELEASEHOOK)0x0) {
    (*this->_releasehook)(this->_foreignptr,0);
    this->_releasehook = (SQRELEASEHOOK)0x0;
  }
  ::SQObjectPtr::Null(&this->_constructoridx);
  (*(((this->_registry).super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
    super_SQRefCounted._vptr_SQRefCounted[5])();
  (*(((this->_consts).super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
    super_SQRefCounted._vptr_SQRefCounted[5])();
  (*(((this->_metamethodsmap).super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
    super_SQRefCounted._vptr_SQRefCounted[5])();
  ::SQObjectPtr::Null(&this->_registry);
  ::SQObjectPtr::Null(&this->_consts);
  ::SQObjectPtr::Null(&this->_metamethodsmap);
  while (bVar2 = sqvector<SQObjectPtr>::empty(this->_systemstrings), ((bVar2 ^ 0xffU) & 1) != 0) {
    this_00 = sqvector<SQObjectPtr>::back(this->_systemstrings);
    ::SQObjectPtr::Null(this_00);
    sqvector<SQObjectPtr>::pop_back(this->_systemstrings);
  }
  (*(((this->_root_vm).super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
    super_SQRefCounted._vptr_SQRefCounted[5])();
  ::SQObjectPtr::Null(&this->_root_vm);
  ::SQObjectPtr::Null(&this->_table_default_delegate);
  ::SQObjectPtr::Null(&this->_array_default_delegate);
  ::SQObjectPtr::Null(&this->_string_default_delegate);
  ::SQObjectPtr::Null(&this->_number_default_delegate);
  ::SQObjectPtr::Null(&this->_closure_default_delegate);
  ::SQObjectPtr::Null(&this->_generator_default_delegate);
  ::SQObjectPtr::Null(&this->_thread_default_delegate);
  ::SQObjectPtr::Null(&this->_class_default_delegate);
  ::SQObjectPtr::Null(&this->_instance_default_delegate);
  ::SQObjectPtr::Null(&this->_weakref_default_delegate);
  RefTable::Finalize(&this->_refs_table);
  pSVar1 = this->_gc_chain;
  if (pSVar1 != (SQCollectable_conflict *)0x0) {
    (pSVar1->super_SQRefCounted)._uiRef = (pSVar1->super_SQRefCounted)._uiRef + 1;
    while (nx = pSVar1, nx != (SQCollectable_conflict *)0x0) {
      (*(nx->super_SQRefCounted)._vptr_SQRefCounted[5])();
      pSVar1 = nx->_next;
      if (pSVar1 != (SQCollectable_conflict *)0x0) {
        (pSVar1->super_SQRefCounted)._uiRef = (pSVar1->super_SQRefCounted)._uiRef + 1;
      }
      SVar3 = (nx->super_SQRefCounted)._uiRef - 1;
      (nx->super_SQRefCounted)._uiRef = SVar3;
      if (SVar3 == 0) {
        (*(nx->super_SQRefCounted)._vptr_SQRefCounted[2])();
      }
    }
  }
  if (this->_gc_chain != (SQCollectable_conflict *)0x0) {
    __assert_fail("_gc_chain==NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/deps/squirrel/squirrel/sqstate.cpp"
                  ,0xc6,"SQSharedState::~SQSharedState()");
  }
  while (this->_gc_chain != (SQCollectable_conflict *)0x0) {
    (this->_gc_chain->super_SQRefCounted)._uiRef = (this->_gc_chain->super_SQRefCounted)._uiRef + 1;
    (*(this->_gc_chain->super_SQRefCounted)._vptr_SQRefCounted[2])();
  }
  sqvector<SQObjectPtr>::~sqvector(this->_types);
  sq_vm_free(this->_types,0x18);
  sqvector<SQObjectPtr>::~sqvector(this->_systemstrings);
  sq_vm_free(this->_systemstrings,0x18);
  sqvector<SQObjectPtr>::~sqvector(this->_metamethods);
  sq_vm_free(this->_metamethods,0x18);
  SQStringTable::~SQStringTable(this->_stringtable);
  sq_vm_free(this->_stringtable,0x20);
  if (this->_scratchpad != (SQChar *)0x0) {
    sq_vm_free(this->_scratchpad,this->_scratchpadsize);
  }
  ::SQObjectPtr::~SQObjectPtr(&this->_weakref_default_delegate);
  ::SQObjectPtr::~SQObjectPtr(&this->_instance_default_delegate);
  ::SQObjectPtr::~SQObjectPtr(&this->_class_default_delegate);
  ::SQObjectPtr::~SQObjectPtr(&this->_thread_default_delegate);
  ::SQObjectPtr::~SQObjectPtr(&this->_closure_default_delegate);
  ::SQObjectPtr::~SQObjectPtr(&this->_generator_default_delegate);
  ::SQObjectPtr::~SQObjectPtr(&this->_number_default_delegate);
  ::SQObjectPtr::~SQObjectPtr(&this->_string_default_delegate);
  ::SQObjectPtr::~SQObjectPtr(&this->_array_default_delegate);
  ::SQObjectPtr::~SQObjectPtr(&this->_table_default_delegate);
  ::SQObjectPtr::~SQObjectPtr(&this->_root_vm);
  ::SQObjectPtr::~SQObjectPtr(&this->_constructoridx);
  ::SQObjectPtr::~SQObjectPtr(&this->_consts);
  ::SQObjectPtr::~SQObjectPtr(&this->_registry);
  RefTable::~RefTable(&this->_refs_table);
  ::SQObjectPtr::~SQObjectPtr(&this->_metamethodsmap);
  return;
}

Assistant:

SQSharedState::~SQSharedState()
{
    if(_releasehook) { _releasehook(_foreignptr,0); _releasehook = NULL; }
    _constructoridx.Null();
    _table(_registry)->Finalize();
    _table(_consts)->Finalize();
    _table(_metamethodsmap)->Finalize();
    _registry.Null();
    _consts.Null();
    _metamethodsmap.Null();
    while(!_systemstrings->empty()) {
        _systemstrings->back().Null();
        _systemstrings->pop_back();
    }
    _thread(_root_vm)->Finalize();
    _root_vm.Null();
    _table_default_delegate.Null();
    _array_default_delegate.Null();
    _string_default_delegate.Null();
    _number_default_delegate.Null();
    _closure_default_delegate.Null();
    _generator_default_delegate.Null();
    _thread_default_delegate.Null();
    _class_default_delegate.Null();
    _instance_default_delegate.Null();
    _weakref_default_delegate.Null();
    _refs_table.Finalize();
#ifndef NO_GARBAGE_COLLECTOR
    SQCollectable *t = _gc_chain;
    SQCollectable *nx = NULL;
    if(t) {
        t->_uiRef++;
        while(t) {
            t->Finalize();
            nx = t->_next;
            if(nx) nx->_uiRef++;
            if(--t->_uiRef == 0)
                t->Release();
            t = nx;
        }
    }
    assert(_gc_chain==NULL); //just to proove a theory
    while(_gc_chain){
        _gc_chain->_uiRef++;
        _gc_chain->Release();
    }
#endif

    sq_delete(_types,SQObjectPtrVec);
    sq_delete(_systemstrings,SQObjectPtrVec);
    sq_delete(_metamethods,SQObjectPtrVec);
    sq_delete(_stringtable,SQStringTable);
    if(_scratchpad)SQ_FREE(_scratchpad,_scratchpadsize);
}